

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseInfo(SnapObject *snpObject,InflateMap *inflator)

{
  SnapPromiseInfo *pSVar1;
  ScriptContext *ctx;
  RecyclableObject *pRVar2;
  long lVar3;
  uint32 i;
  ulong uVar4;
  undefined1 local_70 [8];
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> resolveReactions;
  JavascriptPromiseReaction *reaction_1;
  undefined1 local_48 [8];
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> rejectReactions;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
                     (snpObject);
  ctx = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (pSVar1->Result == (TTDVar)0x0) {
    reaction_1 = (JavascriptPromiseReaction *)0x0;
  }
  else {
    reaction_1 = (JavascriptPromiseReaction *)InflateMap::InflateTTDVar(inflator,pSVar1->Result);
  }
  local_70 = (undefined1  [8])local_70;
  resolveReactions.
  super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>.
  super_SListNodeBase<Memory::HeapAllocator>.next._0_4_ = 0;
  resolveReactions.
  super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>._8_8_ =
       &Memory::HeapAllocator::Instance;
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < pSVar1->ResolveReactionCount; uVar4 = uVar4 + 1) {
    local_48 = (undefined1  [8])
               NSSnapValues::InflatePromiseReactionInfo
                         ((SnapPromiseReactionInfo *)
                          ((long)&pSVar1->ResolveReactions->PromiseReactionId + lVar3),ctx,inflator)
    ;
    SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Prepend
              ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_70,
               (JavascriptPromiseReaction **)local_48);
    lVar3 = lVar3 + 0x30;
  }
  SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Reverse
            ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
             local_70);
  local_48 = (undefined1  [8])local_48;
  rejectReactions.super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
  .super_SListNodeBase<Memory::HeapAllocator>.next._0_4_ = 0;
  rejectReactions.super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
  ._8_8_ = &Memory::HeapAllocator::Instance;
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < pSVar1->RejectReactionCount; uVar4 = uVar4 + 1) {
    resolveReactions.allocator =
         (Type)NSSnapValues::InflatePromiseReactionInfo
                         ((SnapPromiseReactionInfo *)
                          ((long)&pSVar1->RejectReactions->PromiseReactionId + lVar3),ctx,inflator);
    SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Prepend
              ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_48,
               (JavascriptPromiseReaction **)&resolveReactions.allocator);
    lVar3 = lVar3 + 0x30;
  }
  SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Reverse
            ((SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
             local_48);
  pRVar2 = Js::JavascriptLibrary::CreatePromise_TTD
                     ((ctx->super_ScriptContextBase).javascriptLibrary,pSVar1->Status,
                      pSVar1->isHandled,reaction_1,
                      (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
                      local_70,(SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>
                                *)local_48);
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::~SList
            ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_48);
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::~SList
            ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_70);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseInfo* promiseInfo = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::Var result = (promiseInfo->Result != nullptr) ? inflator->InflateTTDVar(promiseInfo->Result) : nullptr;

            SList<Js::JavascriptPromiseReaction*, HeapAllocator> resolveReactions(&HeapAllocator::Instance);
            for(uint32 i = 0; i < promiseInfo->ResolveReactionCount; ++i)
            {
                Js::JavascriptPromiseReaction* reaction = NSSnapValues::InflatePromiseReactionInfo(promiseInfo->ResolveReactions + i, ctx, inflator);
                resolveReactions.Prepend(reaction);
            }
            resolveReactions.Reverse();

            SList<Js::JavascriptPromiseReaction*, HeapAllocator> rejectReactions(&HeapAllocator::Instance);
            for(uint32 i = 0; i < promiseInfo->RejectReactionCount; ++i)
            {
                Js::JavascriptPromiseReaction* reaction = NSSnapValues::InflatePromiseReactionInfo(promiseInfo->RejectReactions + i, ctx, inflator);
                rejectReactions.Prepend(reaction);
            }
            rejectReactions.Reverse();

            Js::RecyclableObject* res = ctx->GetLibrary()->CreatePromise_TTD(promiseInfo->Status, promiseInfo->isHandled, result, resolveReactions, rejectReactions);

            return res;
        }